

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absOldCex.c
# Opt level: O0

void Saig_ManCbaStop(Saig_ManCba_t *p)

{
  Saig_ManCba_t *p_local;
  
  Vec_VecFreeP(&p->vReg2Frame);
  Vec_VecFreeP(&p->vReg2Value);
  Aig_ManStopP(&p->pFrames);
  Vec_IntFreeP(&p->vMapPiF2A);
  if (p != (Saig_ManCba_t *)0x0) {
    free(p);
  }
  return;
}

Assistant:

void Saig_ManCbaStop( Saig_ManCba_t * p )
{
    Vec_VecFreeP( &p->vReg2Frame );
    Vec_VecFreeP( &p->vReg2Value );
    Aig_ManStopP( &p->pFrames );
    Vec_IntFreeP( &p->vMapPiF2A );
    ABC_FREE( p );
}